

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

string * __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::get_name_abi_cxx11_
          (string *__return_storage_ptr__,section_impl<ELFIO::Elf32_Shdr> *this)

{
  section_impl<ELFIO::Elf32_Shdr> *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

std::string get_name() const override { return name; }